

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitLoop(Graph *this,Loop *curr)

{
  Locals *__x;
  mapped_type pEVar1;
  pointer puVar2;
  pointer puVar3;
  Node *other;
  pointer pvVar4;
  Node *this_00;
  pointer puVar5;
  __uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> _Var6;
  undefined8 *puVar7;
  pointer ppNVar8;
  bool bVar9;
  uint uVar10;
  size_type j;
  mapped_type *ppEVar11;
  size_t sVar12;
  Type TVar13;
  Node *pNVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  pointer ppNVar17;
  Node **value;
  undefined8 *puVar18;
  pointer pvVar19;
  ulong uVar20;
  undefined1 local_88 [8];
  Locals vars;
  Locals previous;
  
  pEVar1 = this->parent;
  vars.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  ppEVar11 = std::__detail::
             _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->expressionParentMap,
                          (key_type *)
                          &vars.
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *ppEVar11 = pEVar1;
  this->parent = (Expression *)curr;
  if ((this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((curr->name).super_IString.str._M_str == (char *)0x0) {
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
    }
    else {
      __x = &this->locals;
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &vars.
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      sVar12 = Function::getNumLocals(this->func);
      for (uVar10 = 0; uVar10 < sVar12; uVar10 = uVar10 + 1) {
        TVar13 = Function::getLocalType(this->func,uVar10);
        pNVar14 = makeVar(this,TVar13);
        (__x->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar10] = pNVar14;
      }
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_88
                 ,__x);
      puVar2 = (this->nodes).
               super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (this->nodes).
               super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
      pmVar15 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->breakStates,&curr->name);
      for (uVar10 = 0; uVar20 = (ulong)uVar10, uVar20 < sVar12; uVar10 = uVar10 + 1) {
        TVar13 = Function::getLocalType(this->func,uVar10);
        if ((TVar13.id & 0xfffffffffffffffe) == 2) {
          pNVar14 = *(pointer)((long)local_88 + uVar20 * 8);
          other = vars.
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar20];
          pvVar4 = (pmVar15->
                   super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar19 = (pmVar15->
                         super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              uVar16 = (long)puVar2 - (long)puVar3 >> 3, pvVar19 != pvVar4; pvVar19 = pvVar19 + 1) {
            ppNVar17 = (pvVar19->
                       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            if (ppNVar17 ==
                (pvVar19->
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish) {
              __assert_fail("!isInUnreachable(other)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                            ,0x14e,"Node *wasm::DataFlow::Graph::doVisitLoop(Loop *)");
            }
            this_00 = ppNVar17[uVar20];
            bVar9 = Node::operator!=(this_00,pNVar14);
            if ((bVar9) && (bVar9 = Node::operator!=(this_00,other), bVar9)) goto LAB_009beb1f;
          }
          for (; puVar5 = (this->nodes).
                          super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
              uVar16 < (ulong)((long)(this->nodes).
                                     super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)
              ; uVar16 = uVar16 + 1) {
            _Var6._M_t.
            super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
            .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl =
                 puVar5[uVar16]._M_t.
                 super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
                 ._M_t;
            puVar7 = *(undefined8 **)
                      ((long)_Var6._M_t.
                             super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                             .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl +
                      0x20);
            for (puVar18 = *(undefined8 **)
                            ((long)_Var6._M_t.
                                   super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                                   .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>.
                                   _M_head_impl + 0x18); puVar18 != puVar7; puVar18 = puVar18 + 1) {
              if ((Node *)*puVar18 == pNVar14) {
                *puVar18 = other;
              }
            }
          }
          ppNVar8 = (this->locals).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppNVar17 = (this->locals).
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppNVar17 != ppNVar8;
              ppNVar17 = ppNVar17 + 1) {
            if (*ppNVar17 == pNVar14) {
              *ppNVar17 = other;
            }
          }
        }
LAB_009beb1f:
      }
      std::_Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
      ~_Vector_base((_Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *
                    )local_88);
      std::_Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
      ~_Vector_base((_Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *
                    )&vars.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLoop(Loop* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // As in Souper's LLVM extractor, we avoid loop phis, as we don't want
    // our traces to represent a value that differs across loop iterations.
    // For example,
    //   %b = block
    //   %x = phi %b, 1, %y
    //   %y = phi %b, 2, %x
    //   %z = eq %x %y
    //   infer %z
    // Here %y refers to the previous iteration's %x.
    // To do this, we set all locals to a Var at the loop entry, then process
    // the inside of the loop. When that is done, we can see if a phi was
    // actually needed for each local. If it was, we leave the Var (it
    // represents an unknown value; analysis stops there), and if not, we
    // can replace the Var with the fixed value.
    // TODO: perhaps some more general uses of DataFlow will want loop phis?
    // TODO: optimize stuff here
    if (isInUnreachable()) {
      return &bad; // none of this matters
    }
    if (!curr->name.is()) {
      visit(curr->body);
      return &bad; // no phis are possible
    }
    auto previous = locals;
    auto numLocals = func->getNumLocals();
    for (Index i = 0; i < numLocals; i++) {
      locals[i] = makeVar(func->getLocalType(i));
    }
    auto vars = locals; // all the Vars we just created
    // We may need to replace values later - only new nodes added from
    // here are relevant.
    auto firstNodeFromLoop = nodes.size();
    // Process the loop body.
    visit(curr->body);
    // Find all incoming paths.
    auto& breaks = breakStates[curr->name];
    // Phis are possible, check for them.
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      bool needPhi = false;
      // We replaced the proper value with a Var. If it's still that
      // Var - or it's the original proper value, which can happen with
      // constants - on all incoming paths, then a phi is not needed.
      auto* var = vars[i];
      auto* proper = previous[i];
      for (auto& other : breaks) {
        assert(!isInUnreachable(other));
        auto& curr = *(other[i]);
        if (curr != *var && curr != *proper) {
          // A phi would be necessary here.
          needPhi = true;
          break;
        }
      }
      if (needPhi) {
        // Nothing to do - leave the Vars, the loop phis are
        // unknown values to us.
      } else {
        // Undo the Var for this local: In every new node added for
        // the loop body, replace references to the Var with the
        // previous value (the value that is all we need instead of a phi).
        for (auto j = firstNodeFromLoop; j < nodes.size(); j++) {
          for (auto*& value : nodes[j].get()->values) {
            if (value == var) {
              value = proper;
            }
          }
        }
        // Also undo in the current local state, which is flowing out
        // of the loop.
        for (auto*& node : locals) {
          if (node == var) {
            node = proper;
          }
        }
      }
    }
    return &bad;
  }